

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O3

void __thiscall
despot::MemoryPool<despot::ChainState>::DeleteAll(MemoryPool<despot::ChainState> *this)

{
  Chunk *pCVar1;
  void *pvVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  long lVar5;
  pointer ppCVar6;
  State *this_00;
  
  ppCVar6 = (this->chunks_).
            super__Vector_base<despot::MemoryPool<despot::ChainState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::ChainState>::Chunk_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar6 !=
      (this->chunks_).
      super__Vector_base<despot::MemoryPool<despot::ChainState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::ChainState>::Chunk_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pCVar1 = *ppCVar6;
      if (pCVar1 != (Chunk *)0x0) {
        this_00 = &pCVar1->Objects[0xff].super_State;
        lVar5 = -0x5800;
        do {
          *(undefined ***)this_00 = &PTR__ChainState_0010ea28;
          pvVar2 = *(void **)(this_00 + 0x40);
          if (pvVar2 != (void *)0x0) {
            operator_delete(pvVar2,*(long *)(this_00 + 0x50) - (long)pvVar2);
          }
          std::
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          ::~vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                     *)(this_00 + 0x20));
          despot::State::~State(this_00);
          this_00 = this_00 + -0x58;
          lVar5 = lVar5 + 0x58;
        } while (lVar5 != 0);
      }
      operator_delete(pCVar1,0x5800);
      ppCVar6 = ppCVar6 + 1;
    } while (ppCVar6 !=
             (this->chunks_).
             super__Vector_base<despot::MemoryPool<despot::ChainState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::ChainState>::Chunk_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    ppCVar3 = (this->chunks_).
              super__Vector_base<despot::MemoryPool<despot::ChainState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::ChainState>::Chunk_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppCVar6 != ppCVar3) {
      (this->chunks_).
      super__Vector_base<despot::MemoryPool<despot::ChainState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::ChainState>::Chunk_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppCVar3;
    }
  }
  ppCVar4 = (this->freelist_).
            super__Vector_base<despot::ChainState_*,_std::allocator<despot::ChainState_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->freelist_).
      super__Vector_base<despot::ChainState_*,_std::allocator<despot::ChainState_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar4) {
    (this->freelist_).
    super__Vector_base<despot::ChainState_*,_std::allocator<despot::ChainState_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppCVar4;
  }
  this->num_allocated_ = 0;
  return;
}

Assistant:

void DeleteAll() {
		for (chunk_iterator_ i_chunk = chunks_.begin();
			i_chunk != chunks_.end(); ++i_chunk)
			delete *i_chunk;
		chunks_.clear();
		freelist_.clear();
		num_allocated_ = 0;
	}